

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O2

int xz_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  int iVar1;
  int iVar2;
  void *__s1;
  ssize_t avail;
  
  __s1 = __archive_read_filter_ahead(filter,6,&avail);
  if (__s1 == (void *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar1 = bcmp(__s1,anon_var_dwarf_7dea4,6);
    iVar2 = 0x30;
    if (iVar1 != 0) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int
xz_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *buffer;
	ssize_t avail;

	(void)self; /* UNUSED */

	buffer = __archive_read_filter_ahead(filter, 6, &avail);
	if (buffer == NULL)
		return (0);

	/*
	 * Verify Header Magic Bytes : FD 37 7A 58 5A 00
	 */
	if (memcmp(buffer, "\xFD\x37\x7A\x58\x5A\x00", 6) != 0)
		return (0);

	return (48);
}